

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int Entry2;
  Wlc_Obj_t *pWVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar7;
  Wlc_Obj_t *pWVar8;
  Wlc_Obj_t *p_01;
  int iObj2_3;
  int iObjNew_1;
  int nRegs_1;
  int AddrW_1;
  int DataW_1;
  Wlc_Obj_t *pAddr_1;
  Wlc_Obj_t *pMem_1;
  Vec_Int_t *vTemp_1;
  int iObj2_2;
  int iObj2_1;
  int iObj2;
  int iObjDec;
  int iObjNew;
  int nRegs;
  int AddrW;
  int DataW;
  Wlc_Obj_t *pData;
  Wlc_Obj_t *pAddr;
  Wlc_Obj_t *pMem;
  Vec_Int_t *vBits;
  Vec_Int_t *vTemp;
  int iFanin;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vFanins_local;
  int iObj_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  iVar1 = Wlc_ObjCopy(p,iObj);
  if (iVar1 == 0) {
    pWVar5 = Wlc_NtkObj(p,iObj);
    for (vTemp._4_4_ = 0; iVar1 = Wlc_ObjFaninNum(pWVar5), vTemp._4_4_ < iVar1;
        vTemp._4_4_ = vTemp._4_4_ + 1) {
      iVar1 = Wlc_ObjFaninId(pWVar5,vTemp._4_4_);
      Wlc_NtkMemBlast_rec(pNew,p,iVar1,vFanins);
    }
    if ((undefined1  [24])((undefined1  [24])*pWVar5 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x37) {
      pVVar6 = Vec_IntAlloc(1);
      p_00 = Vec_IntAlloc(100);
      pWVar7 = Wlc_ObjFanin0(p,pWVar5);
      pWVar8 = Wlc_ObjFanin1(p,pWVar5);
      p_01 = Wlc_ObjFanin2(p,pWVar5);
      iVar1 = Wlc_ObjRange(p_01);
      iVar2 = Wlc_ObjRange(pWVar8);
      iVar2 = 1 << ((byte)iVar2 & 0x1f);
      iVar3 = Wlc_ObjRange(pWVar7);
      if (iVar2 * iVar1 != iVar3) {
        __assert_fail("nRegs * DataW == Wlc_ObjRange(pMem)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x42,"void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)");
      }
      iVar3 = Wlc_ObjRange(pWVar5);
      iVar4 = Wlc_ObjRange(pWVar7);
      if (iVar3 != iVar4) {
        __assert_fail("Wlc_ObjRange(pObj) == Wlc_ObjRange(pMem)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x43,"void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)");
      }
      iVar3 = Wlc_ObjAlloc(pNew,0x3a,0,iVar2 + -1,0);
      iVar4 = Wlc_ObjId(p,pWVar8);
      iVar4 = Wlc_ObjCopy(p,iVar4);
      Vec_IntFill(pVVar6,1,iVar4);
      pWVar5 = Wlc_NtkObj(pNew,iVar3);
      Wlc_ObjAddFanins(pNew,pWVar5,pVVar6);
      for (vTemp._4_4_ = 0; vTemp._4_4_ < iVar2; vTemp._4_4_ = vTemp._4_4_ + 1) {
        iVar4 = Wlc_ObjAlloc(pNew,0x16,0,vTemp._4_4_,vTemp._4_4_);
        Vec_IntFill(pVVar6,1,iVar3);
        Vec_IntPushTwo(pVVar6,vTemp._4_4_,vTemp._4_4_);
        pWVar5 = Wlc_NtkObj(pNew,iVar4);
        Wlc_ObjAddFanins(pNew,pWVar5,pVVar6);
        Vec_IntPush(p_00,iVar4);
      }
      Vec_IntClear(vFanins);
      for (vTemp._4_4_ = 0; vTemp._4_4_ < iVar2; vTemp._4_4_ = vTemp._4_4_ + 1) {
        iVar3 = Wlc_ObjAlloc(pNew,0x16,0,vTemp._4_4_ * iVar1 + iVar1 + -1,vTemp._4_4_ * iVar1);
        iVar4 = Wlc_ObjId(p,pWVar7);
        iVar4 = Wlc_ObjCopy(p,iVar4);
        Vec_IntFill(pVVar6,1,iVar4);
        Vec_IntPushTwo(pVVar6,vTemp._4_4_ * iVar1 + iVar1 + -1,vTemp._4_4_ * iVar1);
        pWVar5 = Wlc_NtkObj(pNew,iVar3);
        Wlc_ObjAddFanins(pNew,pWVar5,pVVar6);
        Vec_IntPush(vFanins,iVar3);
      }
      for (vTemp._4_4_ = 0; vTemp._4_4_ < iVar2; vTemp._4_4_ = vTemp._4_4_ + 1) {
        iVar3 = Wlc_ObjAlloc(pNew,8,0,iVar1 + -1,0);
        iVar4 = Vec_IntEntry(p_00,vTemp._4_4_);
        Vec_IntFill(pVVar6,1,iVar4);
        iVar4 = Wlc_ObjId(p,p_01);
        iVar4 = Wlc_ObjCopy(p,iVar4);
        Entry2 = Vec_IntEntry(vFanins,vTemp._4_4_);
        Vec_IntPushTwo(pVVar6,iVar4,Entry2);
        pWVar5 = Wlc_NtkObj(pNew,iVar3);
        Wlc_ObjAddFanins(pNew,pWVar5,pVVar6);
        Vec_IntWriteEntry(vFanins,vTemp._4_4_,iVar3);
      }
      iVar1 = Wlc_ObjAlloc(pNew,0x17,0,iVar2 * iVar1 + -1,0);
      pWVar5 = Wlc_NtkObj(pNew,iVar1);
      Wlc_ObjAddFanins(pNew,pWVar5,vFanins);
      Wlc_ObjSetCopy(p,iObj,iVar1);
      Vec_IntFree(pVVar6);
      Vec_IntFree(p_00);
    }
    else if ((undefined1  [24])((undefined1  [24])*pWVar5 & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x36) {
      pVVar6 = Vec_IntAlloc(1);
      pWVar7 = Wlc_ObjFanin0(p,pWVar5);
      pWVar8 = Wlc_ObjFanin1(p,pWVar5);
      iVar1 = Wlc_ObjRange(pWVar5);
      iVar2 = Wlc_ObjRange(pWVar8);
      iVar2 = 1 << ((byte)iVar2 & 0x1f);
      iVar3 = Wlc_ObjRange(pWVar7);
      if (iVar2 * iVar1 != iVar3) {
        __assert_fail("nRegs * DataW == Wlc_ObjRange(pMem)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x73,"void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)");
      }
      Vec_IntClear(vFanins);
      iVar3 = Wlc_ObjId(p,pWVar8);
      iVar3 = Wlc_ObjCopy(p,iVar3);
      Vec_IntPush(vFanins,iVar3);
      for (vTemp._4_4_ = 0; vTemp._4_4_ < iVar2; vTemp._4_4_ = vTemp._4_4_ + 1) {
        iVar3 = Wlc_ObjAlloc(pNew,0x16,0,vTemp._4_4_ * iVar1 + iVar1 + -1,vTemp._4_4_ * iVar1);
        iVar4 = Wlc_ObjId(p,pWVar7);
        iVar4 = Wlc_ObjCopy(p,iVar4);
        Vec_IntFill(pVVar6,1,iVar4);
        Vec_IntPushTwo(pVVar6,vTemp._4_4_ * iVar1 + iVar1 + -1,vTemp._4_4_ * iVar1);
        pWVar5 = Wlc_NtkObj(pNew,iVar3);
        Wlc_ObjAddFanins(pNew,pWVar5,pVVar6);
        Vec_IntPush(vFanins,iVar3);
      }
      iVar1 = Wlc_ObjAlloc(pNew,8,0,iVar1 + -1,0);
      pWVar5 = Wlc_NtkObj(pNew,iVar1);
      Wlc_ObjAddFanins(pNew,pWVar5,vFanins);
      Wlc_ObjSetCopy(p,iObj,iVar1);
      Vec_IntFree(pVVar6);
    }
    else {
      Wlc_ObjDup(pNew,p,iObj,vFanins);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Memory blasting.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkMemBlast_rec( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj;
    int i, iFanin;
    if ( Wlc_ObjCopy(p, iObj) )
        return;
    pObj = Wlc_NtkObj( p, iObj );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkMemBlast_rec( pNew, p, iFanin, vFanins );
    if ( pObj->Type == WLC_OBJ_WRITE )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( 1 );
        Vec_Int_t * vBits = Vec_IntAlloc( 100 );
        Wlc_Obj_t * pMem  = Wlc_ObjFanin0(p, pObj);
        Wlc_Obj_t * pAddr = Wlc_ObjFanin1(p, pObj);
        Wlc_Obj_t * pData = Wlc_ObjFanin2(p, pObj);
        int DataW = Wlc_ObjRange(pData);
        int AddrW = Wlc_ObjRange(pAddr);
        int nRegs = 1 << AddrW, iObjNew, iObjDec;
        assert( nRegs * DataW == Wlc_ObjRange(pMem) );
        assert( Wlc_ObjRange(pObj) == Wlc_ObjRange(pMem) );
        // create decoder
        iObjDec = Wlc_ObjAlloc( pNew, WLC_OBJ_DEC, 0, nRegs-1, 0 );
        Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pAddr)) );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjDec), vTemp );
        // create decoder bits
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i, i );
            Vec_IntFill( vTemp, 1, iObjDec );
            Vec_IntPushTwo( vTemp, i, i );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vBits, iObj2 );
        }
        // create data words
        Vec_IntClear( vFanins );
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i*DataW+DataW-1, i*DataW );
            Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pMem)) );
            Vec_IntPushTwo( vTemp, i*DataW+DataW-1, i*DataW );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vFanins, iObj2 );
        }
        // create MUXes of data words controlled by decoder bits
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, DataW-1, 0 );
            Vec_IntFill( vTemp, 1, Vec_IntEntry(vBits, i) );
            Vec_IntPushTwo( vTemp, Wlc_ObjCopy(p, Wlc_ObjId(p, pData)), Vec_IntEntry(vFanins, i) );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntWriteEntry( vFanins, i, iObj2 );
        }
        // concatenate the results
        iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_CONCAT, 0, nRegs*DataW-1, 0 );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
        Wlc_ObjSetCopy( p, iObj, iObjNew );
        Vec_IntFree( vTemp );
        Vec_IntFree( vBits );
    }
    else if ( pObj->Type == WLC_OBJ_READ )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( 1 );
        Wlc_Obj_t * pMem  = Wlc_ObjFanin0(p, pObj);
        Wlc_Obj_t * pAddr = Wlc_ObjFanin1(p, pObj);
        int DataW = Wlc_ObjRange(pObj);
        int AddrW = Wlc_ObjRange(pAddr);
        int nRegs = 1 << AddrW, iObjNew;
        assert( nRegs * DataW == Wlc_ObjRange(pMem) );
        Vec_IntClear( vFanins );
        Vec_IntPush( vFanins, Wlc_ObjCopy(p, Wlc_ObjId(p, pAddr)) );
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i*DataW+DataW-1, i*DataW );
            Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pMem)) );
            Vec_IntPushTwo( vTemp, i*DataW+DataW-1, i*DataW );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vFanins, iObj2 );
        }
        iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, DataW-1, 0 );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
        Wlc_ObjSetCopy( p, iObj, iObjNew );
        Vec_IntFree( vTemp );
    }
    else
        Wlc_ObjDup( pNew, p, iObj, vFanins );
}